

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_server_main(http_server_t *server,void *data)

{
  int iVar1;
  long lVar2;
  fd_set *__arr;
  undefined1 auStack_b8 [4];
  uint __i;
  timeval tout;
  fd_set fds;
  int i;
  void *data_local;
  http_server_t *server_local;
  
  http_server_assert(server);
  tout.tv_sec = 0;
  _auStack_b8 = 0;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    fds.__fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  lVar2 = (long)(server->fd / 0x40);
  fds.__fds_bits[lVar2 + -1] =
       1L << ((byte)((long)server->fd % 0x40) & 0x3f) | fds.__fds_bits[lVar2 + -1];
  for (fds.__fds_bits[0xf]._4_4_ = 0; fds.__fds_bits[0xf]._4_4_ < server->num_clients;
      fds.__fds_bits[0xf]._4_4_ = fds.__fds_bits[0xf]._4_4_ + 1) {
    if (server->clients[(int)fds.__fds_bits[0xf]._4_4_].fd != -1) {
      lVar2 = (long)(server->clients[(int)fds.__fds_bits[0xf]._4_4_].fd / 0x40);
      fds.__fds_bits[lVar2 + -1] =
           1L << ((byte)((long)server->clients[(int)fds.__fds_bits[0xf]._4_4_].fd % 0x40) & 0x3f) |
           fds.__fds_bits[lVar2 + -1];
    }
  }
  iVar1 = select(0x400,(fd_set *)&tout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)auStack_b8);
  if (iVar1 < 0) {
    server_local._4_4_ = 0;
  }
  else if (((fds.__fds_bits[(long)(server->fd / 0x40) + -1] &
            1L << ((byte)((long)server->fd % 0x40) & 0x3f)) == 0) ||
          (iVar1 = http_server_accept(server), iVar1 != 0)) {
    for (fds.__fds_bits[0xf]._4_4_ = 0; fds.__fds_bits[0xf]._4_4_ < server->num_clients;
        fds.__fds_bits[0xf]._4_4_ = fds.__fds_bits[0xf]._4_4_ + 1) {
      if (((server->clients[(int)fds.__fds_bits[0xf]._4_4_].fd != -1) &&
          ((fds.__fds_bits[(long)(server->clients[(int)fds.__fds_bits[0xf]._4_4_].fd / 0x40) + -1] &
           1L << ((byte)((long)server->clients[(int)fds.__fds_bits[0xf]._4_4_].fd % 0x40) & 0x3f))
           != 0)) &&
         (iVar1 = http_handle_client(server,server->clients + (int)fds.__fds_bits[0xf]._4_4_,data),
         iVar1 < 0)) {
        http_client_close(server,server->clients + (int)fds.__fds_bits[0xf]._4_4_);
      }
    }
    http_server_check(server);
    server_local._4_4_ = 1;
  }
  else {
    server_local._4_4_ = 0;
  }
  return server_local._4_4_;
}

Assistant:

int http_server_main(http_server_t *server, void *data) {
  http_server_assert(server);

  int i;
  
  fd_set fds;
  struct timeval tout;
  
  tout.tv_usec = 0;
  tout.tv_sec = 0;
  
  FD_ZERO(&fds);
  
  /* Select the listening HTTP socket. */
  FD_SET(server->fd, &fds);
  
  /* Select all active client sockets. */
  for (i = 0; i < server->num_clients; i++) {
    if (server->clients[i].fd != -1) {
      FD_SET(server->clients[i].fd, &fds);
    }
  }
  
  if (select(FD_SETSIZE, &fds, NULL, NULL, &tout) < 0) {
    return 0;
  }
  
  /* Accept incoming connections. */
  if (FD_ISSET(server->fd, &fds)) {
    if (!http_server_accept(server))
      return 0;
  }
  
  /* Read incoming client data. */
  for (i = 0; i < server->num_clients; i++) {
    if ((server->clients[i].fd != -1) &&
        (FD_ISSET(server->clients[i].fd, &fds))) {
      if (http_handle_client(server, server->clients + i, data) < 0) {
        http_client_close(server, server->clients + i);
      }
    }
  }
  
  /* Check for client timeouts. */
  http_server_check(server);
  
  return 1;
}